

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClosedFileInputSource.cc
# Opt level: O0

void __thiscall
ClosedFileInputSource::ClosedFileInputSource(ClosedFileInputSource *this,char *filename)

{
  char *__s;
  allocator<char> local_19;
  char *local_18;
  char *filename_local;
  ClosedFileInputSource *this_local;
  
  local_18 = filename;
  filename_local = (char *)this;
  InputSource::InputSource(&this->super_InputSource);
  __s = local_18;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__ClosedFileInputSource_0058ea88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->filename,__s,&local_19);
  std::allocator<char>::~allocator(&local_19);
  this->offset = 0;
  std::shared_ptr<FileInputSource>::shared_ptr(&this->fis);
  this->stay_open = false;
  return;
}

Assistant:

ClosedFileInputSource::ClosedFileInputSource(char const* filename) :
    filename(filename),
    offset(0),
    stay_open(false)
{
}